

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

void __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::erase
          (Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_> *this,
          StringPtr *row)

{
  StringPtr *pSVar1;
  bool bVar2;
  StringPtr *row_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  pSVar1 = Vector<unsigned_int>::begin((Vector<unsigned_int> *)this);
  bVar2 = false;
  if (pSVar1 <= row) {
    pSVar1 = Vector<unsigned_int>::end((Vector<unsigned_int> *)this);
    bVar2 = row < pSVar1;
  }
  if (!bVar2) {
    kj::_::inlineRequireFailure
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h"
               ,0x303,"&row >= rows.begin() && &row < rows.end()",
               "\"row is not a member of this table\"","row is not a member of this table");
  }
  pSVar1 = Vector<unsigned_int>::begin((Vector<unsigned_int> *)this);
  eraseImpl(this,(long)row - (long)pSVar1 >> 2);
  return;
}

Assistant:

void Table<Row, Indexes...>::erase(Row& row) {
  KJ_TABLE_IREQUIRE(&row >= rows.begin() && &row < rows.end(), "row is not a member of this table");
  eraseImpl(&row - rows.begin());
}